

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O3

void __thiscall crypto_tests::chacha20_midblock::test_method(chacha20_midblock *this)

{
  byte *pbVar1;
  byte *pbVar2;
  long lVar3;
  ChaCha20 *pCVar4;
  ChaCha20 *pCVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  bool bVar8;
  byte bVar9;
  Span<const_std::byte> key_00;
  Span<std::byte> out;
  Span<const_std::byte> key_01;
  Span<std::byte> out_00;
  Span<std::byte> out_01;
  Span<std::byte> out_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  byte b2 [7];
  byte b1 [5];
  byte b3 [52];
  byte block [64];
  ChaCha20 c20;
  array<std::byte,_32UL> key;
  check_type cVar10;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  assertion_result local_218;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  byte local_1dc [7];
  byte local_1d5 [5];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0;
  char **local_1b8;
  byte abStack_164 [4];
  uint local_160;
  byte local_158 [64];
  byte local_118 [5];
  byte abStack_113 [7];
  byte abStack_10c [64];
  ChaCha20 local_cc;
  byte local_58 [32];
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0x10] = 0;
  local_58[0x11] = 0;
  local_58[0x12] = 0;
  local_58[0x13] = 0;
  local_58[0x14] = 0;
  local_58[0x15] = 0;
  local_58[0x16] = 0;
  local_58[0x17] = 0;
  local_58[0x18] = 0;
  local_58[0x19] = 0;
  local_58[0x1a] = 0;
  local_58[0x1b] = 0;
  local_58[0x1c] = 0;
  local_58[0x1d] = 0;
  local_58[0x1e] = 0;
  local_58[0x1f] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  key_00.m_size = 0x20;
  key_00.m_data = local_58;
  ChaCha20Aligned::ChaCha20Aligned(&local_cc.m_aligned,key_00);
  local_cc.m_bufleft = 0;
  out.m_size = 0x40;
  out.m_data = local_118;
  ChaCha20::Keystream(&local_cc,out);
  key_01.m_size = 0x20;
  key_01.m_data = local_58;
  ChaCha20Aligned::ChaCha20Aligned((ChaCha20Aligned *)local_1d0,key_01);
  local_160 = 0;
  pCVar4 = (ChaCha20 *)local_1d0;
  pCVar5 = &local_cc;
  for (lVar3 = 0x1d; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pCVar5->m_aligned).input[0] = (pCVar4->m_aligned).input[0];
    pCVar4 = (ChaCha20 *)((long)pCVar4 + (ulong)bVar9 * -8 + 4);
    pCVar5 = (ChaCha20 *)((long)pCVar5 + (ulong)bVar9 * -8 + 4);
  }
  ChaCha20::~ChaCha20((ChaCha20 *)local_1d0);
  out_00.m_size = 5;
  out_00.m_data = local_1d5;
  ChaCha20::Keystream(&local_cc,out_00);
  out_01.m_size = 7;
  out_01.m_data = local_1dc;
  ChaCha20::Keystream(&local_cc,out_01);
  out_02.m_size = 0x34;
  out_02.m_data = local_158;
  ChaCha20::Keystream(&local_cc,out_02);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x34e;
  file.m_begin = (iterator)&local_1f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_200,msg);
  lVar3 = 0;
  do {
    pbVar1 = local_118 + lVar3;
    pbVar2 = local_1d5 + lVar3;
    if (*pbVar1 != *pbVar2) break;
    bVar8 = lVar3 != 4;
    lVar3 = lVar3 + 1;
  } while (bVar8);
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*pbVar1 == *pbVar2);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_228 = "std::ranges::equal(Span{block}.first(5), b1)";
  local_220 = "";
  local_1d0[8] = false;
  local_1d0._0_8_ = &PTR__lazy_ostream_01389048;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_230 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_1b8 = &local_228;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)local_1d0,1,0,WARN,_cVar10,(size_t)&local_238,0x34e);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x34f;
  file_00.m_begin = (iterator)&local_248;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_258,
             msg_00);
  lVar3 = 0;
  do {
    pbVar1 = abStack_113 + lVar3;
    pbVar2 = local_1dc + lVar3;
    if (*pbVar1 != *pbVar2) break;
    bVar8 = lVar3 != 6;
    lVar3 = lVar3 + 1;
  } while (bVar8);
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*pbVar1 == *pbVar2);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_228 = "std::ranges::equal(Span{block}.subspan(5, 7), b2)";
  local_220 = "";
  local_1d0[8] = false;
  local_1d0._0_8_ = &PTR__lazy_ostream_01389048;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_260 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_1b8 = &local_228;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)local_1d0,1,0,WARN,_cVar10,(size_t)&local_268,0x34f);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x350;
  file_01.m_begin = (iterator)&local_278;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_288,
             msg_01);
  lVar3 = 0xc;
  do {
    pbVar1 = local_118 + lVar3;
    pbVar2 = abStack_164 + lVar3;
    if (*pbVar1 != *pbVar2) break;
    bVar8 = lVar3 != 0x3f;
    lVar3 = lVar3 + 1;
  } while (bVar8);
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*pbVar1 == *pbVar2);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_228 = "std::ranges::equal(Span{block}.last(52), b3)";
  local_220 = "";
  local_1d0[8] = false;
  local_1d0._0_8_ = &PTR__lazy_ostream_01389048;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_290 = "";
  local_1b8 = &local_228;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)local_1d0,1,0,WARN,_cVar10,(size_t)&local_298,0x350);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  ChaCha20::~ChaCha20(&local_cc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(chacha20_midblock)
{
    auto key = "0000000000000000000000000000000000000000000000000000000000000000"_hex;
    ChaCha20 c20{key};
    // get one block of keystream
    std::byte block[64];
    c20.Keystream(block);
    std::byte b1[5], b2[7], b3[52];
    c20 = ChaCha20{key};
    c20.Keystream(b1);
    c20.Keystream(b2);
    c20.Keystream(b3);

    BOOST_CHECK(std::ranges::equal(Span{block}.first(5), b1));
    BOOST_CHECK(std::ranges::equal(Span{block}.subspan(5, 7), b2));
    BOOST_CHECK(std::ranges::equal(Span{block}.last(52), b3));
}